

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined4 uVar5;
  wostream *pwVar6;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar7;
  wchar_t local_44;
  io_range<const_unsigned_long_*> local_40;
  
  lVar2 = *(long *)out;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar3 + 0x18);
  *(undefined4 *)(out + lVar3 + 0x18) = 0x26;
  plVar4 = *(long **)(out + *(long *)(lVar2 + -0x18) + 0xf0);
  if (plVar4 != (long *)0x0) {
    uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x28);
    local_40.first = (unsigned_long *)CONCAT44(local_40.first._4_4_,uVar5);
    pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)out,(wchar_t *)&local_40,1);
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,S->mti);
    plVar4 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
    if (plVar4 != (long *)0x0) {
      uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
      local_40.first = (unsigned_long *)CONCAT44(local_40.first._4_4_,uVar5);
      pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar6,(wchar_t *)&local_40,1);
      local_40.first = S->mt;
      local_40.last = (unsigned_long *)(S + 1);
      local_40.delim_str = " ";
      pbVar7 = utility::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar6,
                                   &local_40);
      plVar4 = *(long **)(pbVar7 + *(long *)(*(long *)pbVar7 + -0x18) + 0xf0);
      if (plVar4 != (long *)0x0) {
        local_44 = (**(code **)(*plVar4 + 0x50))(plVar4,0x29);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)pbVar7,&local_44,1);
        *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
        return out;
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.mti << ' ' << utility::make_io_range(S.mt, S.mt + N, " ") << ')';
        out.flags(flags);
        return out;
      }